

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int get_max_freq_khz(int cpuid)

{
  int iVar1;
  uint in_EDI;
  int nscan_2;
  int freq_khz_1;
  int max_freq_khz;
  int nscan_1;
  int max_freq_khz_2;
  int nscan;
  int freq_khz;
  int max_freq_khz_1;
  FILE *fp;
  char path [256];
  int local_12c;
  int local_128;
  uint local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  FILE *local_110;
  char local_108 [256];
  uint local_8;
  
  local_8 = in_EDI;
  sprintf(local_108,"/sys/devices/system/cpu/cpufreq/stats/cpu%d/time_in_state",(ulong)in_EDI);
  local_110 = fopen(local_108,"rb");
  if (local_110 == (FILE *)0x0) {
    sprintf(local_108,"/sys/devices/system/cpu/cpu%d/cpufreq/stats/time_in_state",(ulong)local_8);
    local_110 = fopen(local_108,"rb");
    if (local_110 != (FILE *)0x0) {
      local_114 = 0;
      while (iVar1 = feof(local_110), iVar1 == 0) {
        local_118 = 0;
        local_11c = __isoc99_fscanf(local_110,"%d %*d",&local_118);
        if (local_11c != 1) break;
        if (local_114 < local_118) {
          local_114 = local_118;
        }
      }
      fclose(local_110);
      if (local_114 != 0) {
        return local_114;
      }
      local_110 = (FILE *)0x0;
    }
    if (local_110 == (FILE *)0x0) {
      sprintf(local_108,"/sys/devices/system/cpu/cpu%d/cpufreq/cpuinfo_max_freq",(ulong)local_8);
      local_110 = fopen(local_108,"rb");
      if (local_110 == (FILE *)0x0) {
        return -1;
      }
      local_120 = -1;
      local_124 = __isoc99_fscanf(local_110,"%d",&local_120);
      if (local_124 != 1) {
        fprintf(_stderr,"fscanf cpuinfo_max_freq error %d",(ulong)local_124);
        fprintf(_stderr,"\n");
      }
      fclose(local_110);
      return local_120;
    }
  }
  local_128 = 0;
  while (iVar1 = feof(local_110), iVar1 == 0) {
    local_12c = 0;
    iVar1 = __isoc99_fscanf(local_110,"%d %*d",&local_12c);
    if (iVar1 != 1) break;
    if (local_128 < local_12c) {
      local_128 = local_12c;
    }
  }
  fclose(local_110);
  return local_128;
}

Assistant:

static int get_max_freq_khz(int cpuid)
{
    // first try, for all possible cpu
    char path[256];
    sprintf(path, "/sys/devices/system/cpu/cpufreq/stats/cpu%d/time_in_state", cpuid);

    FILE* fp = fopen(path, "rb");

    if (!fp)
    {
        // second try, for online cpu
        sprintf(path, "/sys/devices/system/cpu/cpu%d/cpufreq/stats/time_in_state", cpuid);
        fp = fopen(path, "rb");

        if (fp)
        {
            int max_freq_khz = 0;
            while (!feof(fp))
            {
                int freq_khz = 0;
                int nscan = fscanf(fp, "%d %*d", &freq_khz);
                if (nscan != 1)
                    break;

                if (freq_khz > max_freq_khz)
                    max_freq_khz = freq_khz;
            }

            fclose(fp);

            if (max_freq_khz != 0)
                return max_freq_khz;

            fp = NULL;
        }

        if (!fp)
        {
            // third try, for online cpu
            sprintf(path, "/sys/devices/system/cpu/cpu%d/cpufreq/cpuinfo_max_freq", cpuid);
            fp = fopen(path, "rb");

            if (!fp)
                return -1;

            int max_freq_khz = -1;
            int nscan = fscanf(fp, "%d", &max_freq_khz);
            if (nscan != 1)
            {
                NCNN_LOGE("fscanf cpuinfo_max_freq error %d", nscan);
            }
            fclose(fp);

            return max_freq_khz;
        }
    }

    int max_freq_khz = 0;
    while (!feof(fp))
    {
        int freq_khz = 0;
        int nscan = fscanf(fp, "%d %*d", &freq_khz);
        if (nscan != 1)
            break;

        if (freq_khz > max_freq_khz)
            max_freq_khz = freq_khz;
    }

    fclose(fp);

    return max_freq_khz;
}